

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

Tim_Man_t * Tim_ManTrim(Tim_Man_t *p,Vec_Int_t *vBoxPres)

{
  uint uVar1;
  uint uVar2;
  Tim_Obj_t *pTVar3;
  Tim_Obj_t *pTVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  Tim_Man_t *pTVar12;
  Vec_Ptr_t *pVVar13;
  float *pfVar14;
  float *Entry;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  
  if (p->vBoxes == (Vec_Ptr_t *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = p->vBoxes->nSize;
  }
  if (vBoxPres->nSize != iVar6) {
    __assert_fail("Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xad,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  uVar5 = Tim_ManPiNum(p);
  iVar6 = Tim_ManPoNum(p);
  pVVar13 = p->vBoxes;
  if ((pVVar13 != (Vec_Ptr_t *)0x0) && (iVar7 = pVVar13->nSize, iVar7 != 0)) {
    for (iVar17 = 0; iVar17 < iVar7; iVar17 = iVar17 + 1) {
      pvVar11 = Vec_PtrEntry(pVVar13,iVar17);
      iVar7 = Vec_IntEntry(vBoxPres,iVar17);
      if (iVar7 != 0) {
        uVar5 = uVar5 + *(int *)((long)pvVar11 + 0xc);
        iVar6 = iVar6 + *(int *)((long)pvVar11 + 8);
      }
      pVVar13 = p->vBoxes;
      iVar7 = pVVar13->nSize;
    }
  }
  uVar1 = p->nCis;
  if ((uVar5 == uVar1) && (iVar6 == p->nCos)) {
    pTVar12 = Tim_ManDup(p,0);
    return pTVar12;
  }
  if ((int)uVar1 <= (int)uVar5) {
    __assert_fail("nNewCis < Tim_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xba,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  uVar2 = p->nCos;
  if ((int)uVar2 <= iVar6) {
    __assert_fail("nNewCos < Tim_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                  ,0xbb,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
  }
  uVar16 = 0;
  uVar15 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar15 = uVar16;
  }
  while ((uVar15 * 0x18 - uVar16 != 0 && (p->pCis != (Tim_Obj_t *)0x0))) {
    *(undefined4 *)((long)&p->pCis->TravId + uVar16) = 0;
    uVar16 = uVar16 + 0x18;
  }
  uVar16 = 0;
  uVar15 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar15 = uVar16;
  }
  while ((uVar15 * 0x18 - uVar16 != 0 && (p->pCos != (Tim_Obj_t *)0x0))) {
    *(undefined4 *)((long)&p->pCos->TravId + uVar16) = 0;
    uVar16 = uVar16 + 0x18;
  }
  pTVar12 = Tim_ManStart(uVar5,iVar6);
  pTVar3 = pTVar12->pCis;
  pTVar4 = p->pCis;
  iVar7 = Tim_ManPiNum(p);
  memcpy(pTVar3,pTVar4,(long)iVar7 * 0x18);
  pTVar3 = pTVar12->pCos;
  iVar17 = Tim_ManPoNum(p);
  iVar7 = p->nCos;
  pTVar4 = p->pCos;
  iVar8 = Tim_ManPoNum(p);
  iVar9 = Tim_ManPoNum(p);
  memcpy(pTVar3 + ((long)iVar6 - (long)iVar17),pTVar4 + ((long)iVar7 - (long)iVar8),
         (long)iVar9 * 0x18);
  if ((p->vDelayTables != (Vec_Ptr_t *)0x0) && (iVar6 = p->vDelayTables->nSize, 0 < iVar6)) {
    pVVar13 = Vec_PtrStart(iVar6);
    pTVar12->vDelayTables = pVVar13;
    for (iVar6 = 0; iVar6 < p->vDelayTables->nSize; iVar6 = iVar6 + 1) {
      pfVar14 = (float *)Vec_PtrEntry(p->vDelayTables,iVar6);
      if (pfVar14 != (float *)0x0) {
        if (iVar6 != (int)*pfVar14) {
          __assert_fail("i == (int)pDelayTable[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                        ,0xd0,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
        }
        uVar5 = (int)pfVar14[2] * (int)pfVar14[1];
        Entry = (float *)malloc((long)(int)uVar5 * 4 + 0xc);
        *Entry = (float)iVar6;
        Entry[1] = (float)(int)pfVar14[1];
        Entry[2] = (float)(int)pfVar14[2];
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
          Entry[uVar15 + 3] = pfVar14[uVar15 + 3];
        }
        pvVar11 = Vec_PtrEntry(pVVar13,iVar6);
        if (pvVar11 != (void *)0x0) {
          __assert_fail("Vec_PtrEntry(pNew->vDelayTables, i) == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                        ,0xda,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
        }
        Vec_PtrWriteEntry(pVVar13,iVar6,Entry);
      }
    }
  }
  if ((p->vBoxes != (Vec_Ptr_t *)0x0) && (0 < p->vBoxes->nSize)) {
    iVar7 = Tim_ManPiNum(p);
    iVar17 = 0;
    iVar6 = 0;
    if (p->vBoxes != (Vec_Ptr_t *)0x0) {
      iVar6 = p->vBoxes->nSize;
    }
    pVVar13 = Vec_PtrAlloc(iVar6);
    pTVar12->vBoxes = pVVar13;
    iVar6 = 0;
    for (; iVar17 < p->vBoxes->nSize; iVar17 = iVar17 + 1) {
      pvVar11 = Vec_PtrEntry(p->vBoxes,iVar17);
      iVar8 = Vec_IntEntry(vBoxPres,iVar17);
      if (iVar8 != 0) {
        Tim_ManCreateBox(pTVar12,iVar6,*(int *)((long)pvVar11 + 8),iVar7,
                         *(int *)((long)pvVar11 + 0xc),*(int *)((long)pvVar11 + 0x10),
                         *(int *)((long)pvVar11 + 0x18));
        iVar8 = -1;
        if (pTVar12->vBoxes != (Vec_Ptr_t *)0x0) {
          iVar8 = pTVar12->vBoxes->nSize + -1;
        }
        iVar10 = Tim_ManBoxCopy(p,iVar17);
        iVar9 = iVar17;
        if (iVar10 != -1) {
          iVar9 = Tim_ManBoxCopy(p,iVar17);
        }
        Tim_ManBoxSetCopy(pTVar12,iVar8,iVar9);
        iVar7 = iVar7 + *(int *)((long)pvVar11 + 0xc);
        iVar6 = iVar6 + *(int *)((long)pvVar11 + 8);
      }
    }
    iVar17 = Tim_ManPoNum(p);
    if (iVar7 != pTVar12->nCis) {
      __assert_fail("curPi == Tim_ManCiNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                    ,0xed,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
    if (iVar17 + iVar6 != pTVar12->nCos) {
      __assert_fail("curPo == Tim_ManCoNum(pNew)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/tim/timMan.c"
                    ,0xee,"Tim_Man_t *Tim_ManTrim(Tim_Man_t *, Vec_Int_t *)");
    }
  }
  return pTVar12;
}

Assistant:

Tim_Man_t * Tim_ManTrim( Tim_Man_t * p, Vec_Int_t * vBoxPres )
{
    Tim_Man_t * pNew;
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    float * pDelayTable, * pDelayTableNew;
    int i, k, nNewCis, nNewCos, nInputs, nOutputs;
    assert( Vec_IntSize(vBoxPres) == Tim_ManBoxNum(p) );
    // count the number of CIs and COs in the trimmed manager
    nNewCis = Tim_ManPiNum(p);
    nNewCos = Tim_ManPoNum(p);
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                nNewCis += pBox->nOutputs;
                nNewCos += pBox->nInputs;
            }
    if ( nNewCis == Tim_ManCiNum(p) && nNewCos == Tim_ManCoNum(p) )
        return Tim_ManDup( p, 0 );
    assert( nNewCis < Tim_ManCiNum(p) );
    assert( nNewCos < Tim_ManCoNum(p) );
    // clear traversal IDs
    Tim_ManForEachCi( p, pObj, i ) 
        pObj->TravId = 0;          
    Tim_ManForEachCo( p, pObj, i ) 
        pObj->TravId = 0;          
    // create new manager
    pNew = Tim_ManStart( nNewCis, nNewCos );
    // copy box connectivity information
    memcpy( pNew->pCis, p->pCis, sizeof(Tim_Obj_t) * Tim_ManPiNum(p) );
    memcpy( pNew->pCos + nNewCos - Tim_ManPoNum(p), 
            p->pCos + Tim_ManCoNum(p) - Tim_ManPoNum(p), 
            sizeof(Tim_Obj_t) * Tim_ManPoNum(p) );
    // duplicate delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    {
        pNew->vDelayTables = Vec_PtrStart( Vec_PtrSize(p->vDelayTables) );
        Tim_ManForEachTable( p, pDelayTable, i )
        {
            if ( pDelayTable == NULL )
                continue;
            assert( i == (int)pDelayTable[0] );
            nInputs   = (int)pDelayTable[1];
            nOutputs  = (int)pDelayTable[2];
            pDelayTableNew = ABC_ALLOC( float, 3 + nInputs * nOutputs );
            pDelayTableNew[0] = (int)pDelayTable[0];
            pDelayTableNew[1] = (int)pDelayTable[1];
            pDelayTableNew[2] = (int)pDelayTable[2];
            for ( k = 0; k < nInputs * nOutputs; k++ )
                pDelayTableNew[3+k] = pDelayTable[3+k];
//            assert( (int)pDelayTableNew[0] == Vec_PtrSize(pNew->vDelayTables) );
            assert( Vec_PtrEntry(pNew->vDelayTables, i) == NULL );
            Vec_PtrWriteEntry( pNew->vDelayTables, i, pDelayTableNew );
        }
    }
    // duplicate boxes
    if ( Tim_ManBoxNum(p) > 0 )
    {
        int curPi = Tim_ManPiNum(p);
        int curPo = 0;
        pNew->vBoxes = Vec_PtrAlloc( Tim_ManBoxNum(p) );
        Tim_ManForEachBox( p, pBox, i )
            if ( Vec_IntEntry(vBoxPres, i) )
            {
                Tim_ManCreateBox( pNew, curPo, pBox->nInputs, curPi, pBox->nOutputs, pBox->iDelayTable, pBox->fBlack );
                Tim_ManBoxSetCopy( pNew, Tim_ManBoxNum(pNew) - 1, Tim_ManBoxCopy(p, i) == -1 ? i : Tim_ManBoxCopy(p, i) );
                curPi += pBox->nOutputs;
                curPo += pBox->nInputs;
            }
        curPo += Tim_ManPoNum(p);
        assert( curPi == Tim_ManCiNum(pNew) );
        assert( curPo == Tim_ManCoNum(pNew) );
    }
    return pNew;
}